

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *a_00;
  uint64_t *puVar2;
  secp256k1_fe *psVar3;
  secp256k1_fe *a_01;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *a_02;
  ulong uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  ulong uVar19;
  uint64_t uVar20;
  secp256k1_fe h3;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe u1;
  secp256k1_fe s2;
  secp256k1_fe z12;
  secp256k1_fe z22;
  undefined1 local_248 [56];
  uint64_t local_210;
  uint64_t local_208;
  uint64_t local_200;
  uint64_t local_1f8;
  int local_1f0;
  undefined1 local_1e8 [56];
  uint64_t uStack_1b0;
  uint64_t local_1a8;
  uint64_t uStack_1a0;
  uint64_t local_198;
  int local_190;
  int local_18c;
  undefined1 local_188 [152];
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  uint local_d0;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  secp256k1_fe local_60;
  
  secp256k1_gej_verify(a);
  secp256k1_gej_verify(b);
  psVar15 = b;
  if ((a->infinity != 0) || (psVar15 = a, b->infinity != 0)) {
    memcpy(r,psVar15,0x98);
    return;
  }
  psVar1 = &b->z;
  secp256k1_fe_sqr(&local_60,psVar1);
  a_00 = &a->z;
  secp256k1_fe_sqr(&local_c8,a_00);
  secp256k1_fe_mul((secp256k1_fe *)(local_188 + 0x60),&a->x,&local_60);
  secp256k1_fe_mul((secp256k1_fe *)local_1e8,&b->x,&local_c8);
  psVar3 = (secp256k1_fe *)(local_248 + 0x30);
  secp256k1_fe_mul(psVar3,&a->y,&local_60);
  secp256k1_fe_mul(psVar3,psVar3,psVar1);
  psVar3 = (secp256k1_fe *)(local_188 + 0x90);
  secp256k1_fe_mul(psVar3,&b->y,&local_c8);
  secp256k1_fe_mul(psVar3,psVar3,a_00);
  secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x60));
  a_02 = (secp256k1_gej *)0x1;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)local_188._136_4_,1);
  local_188._88_8_ = 2;
  local_188._48_8_ = 0x3ffffbfffff0bc - local_188._96_8_;
  local_188._56_8_ = 0x3ffffffffffffc - local_188._104_8_;
  local_188._64_8_ = 0x3ffffffffffffc - local_188._112_8_;
  local_188._72_8_ = 0x3ffffffffffffc - local_188._120_8_;
  local_188._80_8_ = 0x3fffffffffffc - local_188._128_8_;
  secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
  secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
  psVar15 = (secp256k1_gej *)local_1e8;
  secp256k1_fe_verify((secp256k1_fe *)psVar15);
  if ((int)local_1e8._40_4_ < 0x1f) {
    uVar7 = (0x3ffffbfffff0bc - local_188._96_8_) + local_1e8._0_8_;
    uVar20 = (0x3ffffffffffffc - local_188._104_8_) + local_1e8._8_8_;
    uVar17 = (0x3ffffffffffffc - local_188._112_8_) + local_1e8._16_8_;
    uVar13 = (0x3ffffffffffffc - local_188._120_8_) + local_1e8._24_8_;
    uVar19 = (0x3fffffffffffc - local_188._128_8_) + local_1e8._32_8_;
    local_188._92_4_ = 0;
    local_188._88_4_ = local_1e8._40_4_ + 2;
    local_188._48_8_ = uVar7;
    local_188._56_8_ = uVar20;
    local_188._64_8_ = uVar17;
    local_188._72_8_ = uVar13;
    local_188._80_8_ = uVar19;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x90));
    a_02 = (secp256k1_gej *)0x1;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)local_d0,1);
    local_188._40_8_ = 2;
    local_188._0_8_ = 0x3ffffbfffff0bc - local_188._144_8_;
    local_188._8_8_ = 0x3ffffffffffffcU - local_f0;
    local_188._16_8_ = 0x3ffffffffffffcU - local_e8;
    local_188._24_8_ = 0x3ffffffffffffcU - local_e0;
    local_188._32_8_ = 0x3fffffffffffcU - local_d8;
    secp256k1_fe_verify((secp256k1_fe *)local_188);
    secp256k1_fe_verify((secp256k1_fe *)local_188);
    psVar15 = (secp256k1_gej *)(local_248 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    if (0x1e < local_1f0) goto LAB_0011cf72;
    uVar8 = (0x3ffffbfffff0bc - local_188._144_8_) + local_248._48_8_;
    uVar14 = (0x3ffffffffffffcU - local_f0) + local_210;
    uVar18 = (0x3ffffffffffffcU - local_e8) + local_208;
    uVar9 = (0x3ffffffffffffcU - local_e0) + local_200;
    uVar12 = (0x3fffffffffffcU - local_d8) + local_1f8;
    local_188._44_4_ = 0;
    local_188._40_4_ = local_1f0 + 2;
    local_188._0_8_ = uVar8;
    local_188._8_8_ = uVar14;
    local_188._16_8_ = uVar18;
    local_188._24_8_ = uVar9;
    local_188._32_8_ = uVar12;
    secp256k1_fe_verify((secp256k1_fe *)local_188);
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    uVar6 = (uVar19 >> 0x30) * 0x1000003d1 + uVar7;
    if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
      uVar16 = uVar20 + (uVar6 >> 0x34);
      uVar10 = (uVar16 >> 0x34) + uVar17;
      uVar11 = (uVar10 >> 0x34) + uVar13;
      uVar19 = (uVar11 >> 0x34) + (uVar19 & 0xffffffffffff);
      if ((((uVar16 | uVar6 | uVar10 | uVar11) & 0xfffffffffffff) == 0 && uVar19 == 0) ||
         (((uVar6 | 0x1000003d0) & uVar16 & uVar10 & uVar11 & (uVar19 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify((secp256k1_fe *)local_188);
        uVar19 = (uVar12 >> 0x30) * 0x1000003d1 + uVar8;
        if (((uVar19 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar19 & 0xfffffffffffff) == 0)) {
          uVar11 = uVar14 + (uVar19 >> 0x34);
          uVar6 = (uVar11 >> 0x34) + uVar18;
          uVar10 = (uVar6 >> 0x34) + uVar9;
          uVar12 = (uVar10 >> 0x34) + (uVar12 & 0xffffffffffff);
          if ((((uVar11 | uVar19 | uVar6 | uVar10) & 0xfffffffffffff) == 0 && uVar12 == 0) ||
             (((uVar19 | 0x1000003d0) & uVar11 & uVar6 & uVar10 & (uVar12 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            secp256k1_gej_double_var(r,a,(secp256k1_fe *)0x0);
            return;
          }
        }
        secp256k1_gej_set_infinity(r);
        return;
      }
    }
    r->infinity = 0;
    psVar3 = (secp256k1_fe *)(local_1e8 + 0x30);
    a_01 = (secp256k1_fe *)(local_188 + 0x30);
    secp256k1_fe_mul(psVar3,a_01,psVar1);
    secp256k1_fe_mul(&r->z,a_00,psVar3);
    secp256k1_fe_sqr(&local_98,a_01);
    secp256k1_fe_verify(&local_98);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_98._40_8_ & 0xffffffff),1);
    local_98.n[0] = 0x3ffffbfffff0bc - local_98.n[0];
    local_98.n[1] = 0x3ffffffffffffc - local_98.n[1];
    local_98.n[2] = 0x3ffffffffffffc - local_98.n[2];
    local_98.n[3] = 0x3ffffffffffffc - local_98.n[3];
    local_98.n[4] = 0x3fffffffffffc - local_98.n[4];
    local_98.magnitude = 2;
    local_98.normalized = 0;
    secp256k1_fe_verify(&local_98);
    psVar15 = (secp256k1_gej *)local_248;
    secp256k1_fe_mul((secp256k1_fe *)psVar15,&local_98,a_01);
    secp256k1_fe_mul(psVar3,(secp256k1_fe *)(local_188 + 0x60),&local_98);
    a_02 = (secp256k1_gej *)local_188;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_02);
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    iVar5 = local_248._40_4_ + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_0011cf77;
    uVar7 = (r->x).n[1];
    uVar13 = (r->x).n[2];
    uVar17 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_248._0_8_;
    (r->x).n[1] = uVar7 + local_248._8_8_;
    (r->x).n[2] = uVar13 + local_248._16_8_;
    (r->x).n[3] = uVar17 + local_248._24_8_;
    puVar2 = (r->x).n + 4;
    *puVar2 = *puVar2 + local_248._32_8_;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify(&r->x);
    psVar15 = (secp256k1_gej *)(local_1e8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    iVar5 = local_190 + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_0011cf7c;
    uVar7 = (r->x).n[1];
    uVar13 = (r->x).n[2];
    uVar17 = (r->x).n[3];
    psVar15 = (secp256k1_gej *)(local_1e8 + 0x30);
    (r->x).n[0] = (r->x).n[0] + local_1e8._48_8_;
    (r->x).n[1] = uVar7 + uStack_1b0;
    (r->x).n[2] = uVar13 + local_1a8;
    (r->x).n[3] = uVar17 + uStack_1a0;
    puVar2 = (r->x).n + 4;
    *puVar2 = *puVar2 + local_198;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    iVar5 = local_190 + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_0011cf81;
    uVar7 = (r->x).n[1];
    uVar13 = (r->x).n[2];
    uVar17 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_1e8._48_8_;
    (r->x).n[1] = uVar7 + uStack_1b0;
    (r->x).n[2] = uVar13 + local_1a8;
    (r->x).n[3] = uVar17 + uStack_1a0;
    puVar2 = (r->x).n + 4;
    *puVar2 = *puVar2 + local_198;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    psVar15 = r;
    secp256k1_fe_verify(&r->x);
    iVar5 = (r->x).magnitude + local_190;
    if (iVar5 < 0x21) {
      local_1e8._48_8_ = (r->x).n[0] + local_1e8._48_8_;
      uStack_1b0 = (r->x).n[1] + uStack_1b0;
      local_1a8 = (r->x).n[2] + local_1a8;
      uStack_1a0 = (r->x).n[3] + uStack_1a0;
      local_198 = local_198 + (r->x).n[4];
      local_18c = 0;
      local_190 = iVar5;
      secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
      psVar1 = &r->y;
      secp256k1_fe_mul(psVar1,(secp256k1_fe *)(local_1e8 + 0x30),(secp256k1_fe *)local_188);
      psVar15 = (secp256k1_gej *)local_248;
      a_02 = psVar15;
      secp256k1_fe_mul((secp256k1_fe *)psVar15,(secp256k1_fe *)psVar15,
                       (secp256k1_fe *)(local_248 + 0x30));
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)psVar15);
      iVar5 = local_248._40_4_ + (r->y).magnitude;
      if (iVar5 < 0x21) {
        uVar7 = (r->y).n[1];
        uVar13 = (r->y).n[2];
        uVar17 = (r->y).n[3];
        (r->y).n[0] = (r->y).n[0] + local_248._0_8_;
        (r->y).n[1] = uVar7 + local_248._8_8_;
        (r->y).n[2] = uVar13 + local_248._16_8_;
        (r->y).n[3] = uVar17 + local_248._24_8_;
        puVar2 = (r->y).n + 4;
        *puVar2 = *puVar2 + local_248._32_8_;
        (r->y).magnitude = iVar5;
        (r->y).normalized = 0;
        secp256k1_fe_verify(psVar1);
        secp256k1_gej_verify(r);
        return;
      }
      goto LAB_0011cf8b;
    }
  }
  else {
    secp256k1_gej_add_var_cold_7();
LAB_0011cf72:
    secp256k1_gej_add_var_cold_6();
LAB_0011cf77:
    secp256k1_gej_add_var_cold_5();
LAB_0011cf7c:
    secp256k1_gej_add_var_cold_4();
LAB_0011cf81:
    secp256k1_gej_add_var_cold_3();
  }
  secp256k1_gej_add_var_cold_2();
LAB_0011cf8b:
  secp256k1_gej_add_var_cold_1();
  secp256k1_gej_verify(a_02);
  psVar15->infinity = a_02->infinity;
  uVar7 = (a_02->x).n[0];
  uVar13 = (a_02->x).n[1];
  uVar17 = (a_02->x).n[2];
  uVar20 = (a_02->x).n[3];
  iVar5 = (a_02->x).magnitude;
  iVar4 = (a_02->x).normalized;
  (psVar15->x).n[4] = (a_02->x).n[4];
  (psVar15->x).magnitude = iVar5;
  (psVar15->x).normalized = iVar4;
  (psVar15->x).n[2] = uVar17;
  (psVar15->x).n[3] = uVar20;
  (psVar15->x).n[0] = uVar7;
  (psVar15->x).n[1] = uVar13;
  psVar1 = &psVar15->y;
  uVar7 = (a_02->y).n[1];
  uVar13 = (a_02->y).n[2];
  uVar17 = (a_02->y).n[3];
  uVar20 = (a_02->y).n[4];
  iVar5 = (a_02->y).magnitude;
  iVar4 = (a_02->y).normalized;
  (psVar15->y).n[0] = (a_02->y).n[0];
  (psVar15->y).n[1] = uVar7;
  (psVar15->y).n[2] = uVar13;
  (psVar15->y).n[3] = uVar17;
  (psVar15->y).n[4] = uVar20;
  (psVar15->y).magnitude = iVar5;
  (psVar15->y).normalized = iVar4;
  uVar7 = (a_02->z).n[1];
  uVar13 = (a_02->z).n[2];
  uVar17 = (a_02->z).n[3];
  uVar20 = (a_02->z).n[4];
  iVar5 = (a_02->z).magnitude;
  iVar4 = (a_02->z).normalized;
  (psVar15->z).n[0] = (a_02->z).n[0];
  (psVar15->z).n[1] = uVar7;
  (psVar15->z).n[2] = uVar13;
  (psVar15->z).n[3] = uVar17;
  (psVar15->z).n[4] = uVar20;
  (psVar15->z).magnitude = iVar5;
  (psVar15->z).normalized = iVar4;
  secp256k1_fe_verify(psVar1);
  uVar19 = (psVar15->y).n[4];
  uVar12 = (uVar19 >> 0x30) * 0x1000003d1 + (psVar15->y).n[0];
  uVar6 = (uVar12 >> 0x34) + (psVar15->y).n[1];
  uVar10 = (uVar6 >> 0x34) + (psVar15->y).n[2];
  uVar11 = (uVar10 >> 0x34) + (psVar15->y).n[3];
  (psVar15->y).n[0] = uVar12 & 0xfffffffffffff;
  (psVar15->y).n[1] = uVar6 & 0xfffffffffffff;
  (psVar15->y).n[2] = uVar10 & 0xfffffffffffff;
  (psVar15->y).n[3] = uVar11 & 0xfffffffffffff;
  (psVar15->y).n[4] = (uVar11 >> 0x34) + (uVar19 & 0xffffffffffff);
  (psVar15->y).magnitude = 1;
  secp256k1_fe_verify(psVar1);
  secp256k1_fe_verify(psVar1);
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)(psVar15->y).magnitude,1);
  uVar7 = (psVar15->y).n[1];
  uVar13 = (psVar15->y).n[2];
  uVar17 = (psVar15->y).n[3];
  (psVar15->y).n[0] = 0x3ffffbfffff0bc - (psVar15->y).n[0];
  (psVar15->y).n[1] = 0x3ffffffffffffc - uVar7;
  (psVar15->y).n[2] = 0x3ffffffffffffc - uVar13;
  (psVar15->y).n[3] = 0x3ffffffffffffc - uVar17;
  (psVar15->y).n[4] = 0x3fffffffffffc - (psVar15->y).n[4];
  (psVar15->y).magnitude = 2;
  (psVar15->y).normalized = 0;
  secp256k1_fe_verify(psVar1);
  secp256k1_gej_verify(psVar15);
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GEJ_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}